

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_unittests.cc
# Opt level: O1

void __thiscall Simple_All_Test::TestBody(Simple_All_Test *this)

{
  int iVar1;
  pointer ppVar2;
  bool bVar3;
  const_iterator cVar4;
  sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *psVar5;
  value_type *pvVar6;
  value_type *pvVar7;
  uint uVar8;
  long lVar9;
  iterator iVar10;
  pointer piVar11;
  pointer ppVar12;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  pair<google::dense_hashtable_iterator<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>,_bool>
  p;
  AssertionResult gtest_ar;
  sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  smap;
  sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
  sset;
  bool local_281;
  int local_280;
  bool local_279;
  sparse_hashtable_const_iterator<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
  local_278;
  internal local_230 [8];
  sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *local_228;
  pair<google::sparse_hashtable_const_iterator<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>,_bool>
  local_220;
  iterator local_1d0;
  undefined1 local_188 [36];
  type tStack_164;
  size_type sStack_160;
  size_type local_158;
  size_type local_150;
  pointer local_140;
  undefined1 local_138 [48];
  size_type local_108;
  size_type local_100;
  pointer local_f0;
  sparse_hashtable<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
  local_e0;
  sparse_hashtable<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
  local_88;
  
  lVar9 = 0;
  google::
  sparse_hashtable<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
  ::sparse_hashtable(&local_88,0,(hash<int> *)local_188,(equal_to<int> *)&local_220,
                     (Identity *)&local_e0,(SetKey *)local_138,
                     (libc_allocator_with_realloc<int> *)&local_278);
  google::
  sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::sparse_hashtable((sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                      *)&local_e0,0,(hash<int> *)&local_220,(equal_to<int> *)&local_278,
                     (SelectKey *)local_138,(SetKey *)local_188,
                     (libc_allocator_with_realloc<std::pair<const_int,_int>_> *)&local_1d0);
  local_138[0x1a] = false;
  local_138._28_4_ = 0;
  local_138._16_4_ = 0.5;
  local_138._20_4_ = 0.2;
  local_108 = 0;
  local_100 = 0x20;
  local_f0 = (pointer)0x0;
  local_138._8_8_ = 6;
  local_138._0_8_ = 0x10;
  local_188[0x18] = false;
  local_188[0x19] = false;
  local_188[0x1a] = false;
  local_188._28_4_ = 0;
  local_188._16_4_ = 0.5;
  local_188._20_4_ = 0.2;
  stack0xfffffffffffffe98 = (undefined1  [16])0x0;
  local_158 = 0;
  local_150 = 0x20;
  local_140 = (pointer)0x0;
  local_188._8_8_ = 6;
  local_188._0_8_ = 0x10;
  local_138[0x18] = false;
  local_138[0x19] = true;
  local_138._32_16_ = ZEXT816(0xffffffff00000000);
  local_f0 = (pointer)malloc(0x80);
  *local_f0 = -1;
  local_f0[1] = -1;
  local_f0[2] = -1;
  local_f0[3] = -1;
  local_f0[4] = -1;
  local_f0[5] = -1;
  local_f0[6] = -1;
  local_f0[7] = -1;
  local_f0[8] = -1;
  local_f0[9] = -1;
  local_f0[10] = -1;
  local_f0[0xb] = -1;
  local_f0[0xc] = -1;
  local_f0[0xd] = -1;
  local_f0[0xe] = -1;
  local_f0[0xf] = -1;
  local_f0[0x10] = -1;
  local_f0[0x11] = -1;
  local_f0[0x12] = -1;
  local_f0[0x13] = -1;
  local_f0[0x14] = -1;
  local_f0[0x15] = -1;
  local_f0[0x16] = -1;
  local_f0[0x17] = -1;
  local_f0[0x18] = -1;
  local_f0[0x19] = -1;
  local_f0[0x1a] = -1;
  local_f0[0x1b] = -1;
  local_f0[0x1c] = -1;
  local_f0[0x1d] = -1;
  local_f0[0x1e] = -1;
  local_f0[0x1f] = -1;
  local_188[0x19] = true;
  tStack_164 = -1;
  local_140 = (pointer)malloc(0x100);
  do {
    ppVar2 = local_140 + lVar9;
    ppVar2->first = -1;
    ppVar2->second = 0;
    ppVar2[1].first = -1;
    ppVar2[1].second = 0;
    lVar9 = lVar9 + 2;
  } while (lVar9 != 0x20);
  local_278.ht = (sparse_hashtable<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
                  *)((ulong)local_278.ht._4_4_ << 0x20);
  do {
    google::
    sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
    ::insert(&local_220,
             (sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
              *)&local_88,(value_type *)&local_278);
    iVar1 = (int)local_278.ht;
    pvVar6 = google::
             sparse_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::sparse_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::sparse_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
             ::
             find_or_insert<google::sparse_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::DefaultValue>
                       ((sparse_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::sparse_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::sparse_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
                         *)&local_e0,(key_type *)&local_278);
    pvVar6->second = iVar1 + 1;
    local_1d0.ht._0_4_ = (int)local_278.ht + 5;
    google::
    dense_hashtable<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
    ::resize_delta((dense_hashtable<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
                    *)local_138,1);
    google::
    dense_hashtable<int,int,std::hash<int>,google::dense_hash_set<int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<int>>::Identity,google::dense_hash_set<int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<int>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<int>>
    ::insert_noresize<int_const&,int>
              ((pair<google::dense_hashtable_iterator<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>,_bool>
                *)&local_220,
               (dense_hashtable<int,int,std::hash<int>,google::dense_hash_set<int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<int>>::Identity,google::dense_hash_set<int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<int>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<int>>
                *)local_138,(int *)&local_1d0,(int *)&local_1d0);
    iVar1 = (int)local_278.ht;
    local_220.first.ht._0_4_ = (int)local_278.ht + 5;
    pvVar7 = google::
             dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
             ::find_or_insert<int,int>
                       ((dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
                         *)local_188,(int *)&local_220);
    pvVar7->second = iVar1 + 6;
    iVar1 = (int)local_278.ht;
    local_278.ht = (sparse_hashtable<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
                    *)CONCAT44(local_278.ht._4_4_,(int)local_278.ht + 10);
  } while (iVar1 < 0x5a);
  local_280 = 0;
  do {
    google::
    sparse_hashtable<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
    ::find<int>(&local_220.first,&local_88,&local_280);
    local_278.pos.row_begin._M_current =
         local_88.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_278.pos.row_end._M_current =
         local_88.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_278.pos.row_current._M_current =
         local_88.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_278.pos.col_current = (const_nonempty_iterator)0x0;
    local_278.end.row_begin._M_current =
         local_88.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_278.end.row_end._M_current =
         local_88.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_278.end.row_current._M_current =
         local_88.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_278.end.col_current = (const_nonempty_iterator)0x0;
    local_278.ht = &local_88;
    google::
    sparse_hashtable_const_iterator<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
    ::advance_past_deleted(&local_278);
    local_230[0] = (internal)0x1;
    if (((local_220.first.pos.row_begin._M_current == local_278.pos.row_begin._M_current) &&
        (local_220.first.pos.row_end._M_current == local_278.pos.row_end._M_current)) &&
       (local_220.first.pos.row_current._M_current == local_278.pos.row_current._M_current)) {
      if (local_220.first.pos.row_current._M_current == local_220.first.pos.row_end._M_current) {
        local_230[0] = (internal)0x0;
      }
      else {
        local_230[0] = (internal)(local_220.first.pos.col_current != local_278.pos.col_current);
      }
    }
    uVar8 = local_280 * -0x33333333 + 0x19999998;
    local_281 = (uVar8 >> 1 | (uint)((uVar8 & 1) != 0) << 0x1f) < 0x19999999;
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&local_1d0,"sset.find(i) != sset.end()","(i % 10) == 0",(bool *)local_230
               ,&local_281);
    iVar10._M_current = local_1d0.pos.row_begin._M_current;
    if ((char)local_1d0.ht == '\0') {
      testing::Message::Message((Message *)&local_220);
      if (local_1d0.pos.row_begin._M_current ==
          (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           *)0x0) {
        ppVar12 = (pointer)0xafc493;
      }
      else {
        ppVar12 = (local_1d0.pos.row_begin._M_current)->group;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_278,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/simple_unittests.cc"
                 ,0x3c,(char *)ppVar12);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_278,(Message *)&local_220);
LAB_005fcfd5:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_278);
      iVar10._M_current = local_1d0.pos.row_begin._M_current;
      if ((long *)CONCAT44(local_220.first.ht._4_4_,(int)local_220.first.ht) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_220.first.ht._4_4_,(int)local_220.first.ht) + 8))();
        iVar10._M_current = local_1d0.pos.row_begin._M_current;
      }
LAB_005fcff7:
      if (iVar10._M_current !=
          (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           *)0x0) {
        if ((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
             *)(iVar10._M_current)->group != iVar10._M_current + 1) {
          operator_delete((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                           *)(iVar10._M_current)->group);
        }
        operator_delete(iVar10._M_current);
      }
      break;
    }
    if (local_1d0.pos.row_begin._M_current !=
        (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)0x0) {
      if ((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           *)(local_1d0.pos.row_begin._M_current)->group != local_1d0.pos.row_begin._M_current + 1)
      {
        operator_delete((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                         *)(local_1d0.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar10._M_current);
    }
    google::
    sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::find<int>((iterator *)&local_220,
                (sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                 *)&local_e0,&local_280);
    local_278.pos.row_begin._M_current =
         local_e0.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_278.pos.row_end._M_current =
         local_e0.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_278.pos.row_current._M_current =
         local_e0.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_278.pos.col_current = (const_nonempty_iterator)0x0;
    local_278.end.row_begin._M_current =
         local_e0.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_278.end.row_end._M_current =
         local_e0.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_278.end.row_current._M_current =
         local_e0.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_278.end.col_current = (const_nonempty_iterator)0x0;
    local_278.ht = &local_e0;
    google::
    sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::advance_past_deleted
              ((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                *)&local_278);
    local_230[0] = (internal)0x1;
    if (((local_220.first.pos.row_begin._M_current == local_278.pos.row_begin._M_current) &&
        (local_220.first.pos.row_end._M_current == local_278.pos.row_end._M_current)) &&
       (local_220.first.pos.row_current._M_current == local_278.pos.row_current._M_current)) {
      if (local_220.first.pos.row_current._M_current == local_220.first.pos.row_end._M_current) {
        local_230[0] = (internal)0x0;
      }
      else {
        local_230[0] = (internal)(local_220.first.pos.col_current != local_278.pos.col_current);
      }
    }
    uVar8 = local_280 * -0x33333333 + 0x19999998;
    local_281 = (uVar8 >> 1 | (uint)((uVar8 & 1) != 0) << 0x1f) < 0x19999999;
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&local_1d0,"smap.find(i) != smap.end()","(i % 10) == 0",(bool *)local_230
               ,&local_281);
    iVar10._M_current = local_1d0.pos.row_begin._M_current;
    if ((char)local_1d0.ht == '\0') {
      testing::Message::Message((Message *)&local_220);
      if (local_1d0.pos.row_begin._M_current ==
          (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           *)0x0) {
        ppVar12 = (pointer)0xafc493;
      }
      else {
        ppVar12 = (local_1d0.pos.row_begin._M_current)->group;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_278,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/simple_unittests.cc"
                 ,0x3d,(char *)ppVar12);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_278,(Message *)&local_220);
      goto LAB_005fcfd5;
    }
    if (local_1d0.pos.row_begin._M_current !=
        (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)0x0) {
      if ((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           *)(local_1d0.pos.row_begin._M_current)->group != local_1d0.pos.row_begin._M_current + 1)
      {
        operator_delete((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                         *)(local_1d0.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar10._M_current);
    }
    google::
    sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::find<int>((iterator *)&local_220,
                (sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                 *)&local_e0,&local_280);
    local_278.pos.row_begin._M_current =
         local_e0.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_278.pos.row_end._M_current =
         local_e0.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_278.pos.row_current._M_current =
         local_e0.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_278.pos.col_current = (const_nonempty_iterator)0x0;
    local_278.end.row_begin._M_current =
         local_e0.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_278.end.row_end._M_current =
         local_e0.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_278.end.row_current._M_current =
         local_e0.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_278.end.col_current = (const_nonempty_iterator)0x0;
    local_278.ht = &local_e0;
    google::
    sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::advance_past_deleted
              ((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                *)&local_278);
    if (((local_220.first.pos.row_begin._M_current == local_278.pos.row_begin._M_current) &&
        (local_220.first.pos.row_end._M_current == local_278.pos.row_end._M_current)) &&
       ((local_220.first.pos.row_current._M_current == local_278.pos.row_current._M_current &&
        ((local_220.first.pos.row_current._M_current == local_220.first.pos.row_end._M_current ||
         (local_220.first.pos.col_current == local_278.pos.col_current)))))) {
      local_281 = false;
    }
    else {
      google::
      sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
      ::find<int>(&local_1d0,
                  (sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                   *)&local_e0,&local_280);
      local_281 = (local_1d0.pos.col_current)->second == local_280 + 1;
    }
    uVar8 = local_280 * -0x33333333 + 0x19999998;
    local_279 = (uVar8 >> 1 | (uint)((uVar8 & 1) != 0) << 0x1f) < 0x19999999;
    testing::internal::CmpHelperEQ<bool,bool>
              (local_230,"smap.find(i) != smap.end() && smap.find(i)->second == i + 1",
               "(i % 10) == 0",&local_281,&local_279);
    psVar5 = local_228;
    if (local_230[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_220);
      if (local_228 ==
          (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           *)0x0) {
        ppVar12 = (pointer)0xafc493;
      }
      else {
        ppVar12 = local_228->group;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_278,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/simple_unittests.cc"
                 ,0x3f,(char *)ppVar12);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_278,(Message *)&local_220);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_278);
      iVar10._M_current = local_228;
      if ((long *)CONCAT44(local_220.first.ht._4_4_,(int)local_220.first.ht) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_220.first.ht._4_4_,(int)local_220.first.ht) + 8))();
        iVar10._M_current = local_228;
      }
      goto LAB_005fcff7;
    }
    if (local_228 !=
        (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)0x0) {
      if ((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           *)local_228->group != local_228 + 1) {
        operator_delete((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                         *)local_228->group);
      }
      operator_delete(psVar5);
    }
    google::
    dense_hashtable<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
    ::find<int>((const_iterator *)&local_220,
                (dense_hashtable<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
                 *)local_138,&local_280);
    local_1d0.ht._0_4_ =
         CONCAT31(local_1d0.ht._1_3_,
                  local_220.first.pos.row_begin._M_current !=
                  (sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *
                  )(local_f0 + local_100));
    local_230[0] = (internal)(local_280 % 10 == 5);
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&local_278,"dset.find(i) != dset.end()","(i % 10) == 5",
               (bool *)&local_1d0,(bool *)local_230);
    cVar4._M_current = local_278.pos.row_begin._M_current;
    if ((char)local_278.ht == '\0') {
      testing::Message::Message((Message *)&local_220);
      if (local_278.pos.row_begin._M_current ==
          (sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *)0x0) {
        piVar11 = (pointer)0xafc493;
      }
      else {
        piVar11 = (local_278.pos.row_begin._M_current)->group;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/simple_unittests.cc"
                 ,0x40,(char *)piVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d0,(Message *)&local_220);
LAB_005fcf80:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d0);
      iVar10._M_current =
           (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
            *)local_278.pos.row_begin._M_current;
      if ((long *)CONCAT44(local_220.first.ht._4_4_,(int)local_220.first.ht) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_220.first.ht._4_4_,(int)local_220.first.ht) + 8))();
        iVar10._M_current =
             (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
              *)local_278.pos.row_begin._M_current;
      }
      goto LAB_005fcff7;
    }
    if (local_278.pos.row_begin._M_current !=
        (sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *)0x0) {
      if ((sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *)
          (local_278.pos.row_begin._M_current)->group != local_278.pos.row_begin._M_current + 1) {
        operator_delete((sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>
                         *)(local_278.pos.row_begin._M_current)->group);
      }
      operator_delete(cVar4._M_current);
    }
    google::
    dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::find<int>((iterator *)&local_220,
                (dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                 *)local_188,&local_280);
    local_1d0.ht._0_4_ =
         CONCAT31(local_1d0.ht._1_3_,
                  local_220.first.pos.row_begin._M_current !=
                  (sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *
                  )(local_140 + local_150));
    local_230[0] = (internal)(local_280 % 10 == 5);
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&local_278,"dmap.find(i) != dmap.end()","(i % 10) == 5",
               (bool *)&local_1d0,(bool *)local_230);
    cVar4._M_current = local_278.pos.row_begin._M_current;
    if ((char)local_278.ht == '\0') {
      testing::Message::Message((Message *)&local_220);
      if (local_278.pos.row_begin._M_current ==
          (sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *)0x0) {
        piVar11 = (pointer)0xafc493;
      }
      else {
        piVar11 = (local_278.pos.row_begin._M_current)->group;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/simple_unittests.cc"
                 ,0x41,(char *)piVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d0,(Message *)&local_220);
      goto LAB_005fcf80;
    }
    if (local_278.pos.row_begin._M_current !=
        (sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *)0x0) {
      if ((sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *)
          (local_278.pos.row_begin._M_current)->group != local_278.pos.row_begin._M_current + 1) {
        operator_delete((sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>
                         *)(local_278.pos.row_begin._M_current)->group);
      }
      operator_delete(cVar4._M_current);
    }
    google::
    dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::find<int>((iterator *)&local_220,
                (dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                 *)local_188,&local_280);
    if (local_220.first.pos.row_begin._M_current ==
        (sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *)
        (local_140 + local_150)) {
      local_230[0] = (internal)0x0;
    }
    else {
      google::
      dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
      ::find<int>((iterator *)&local_278,
                  (dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                   *)local_188,&local_280);
      local_230[0] = (internal)
                     (*(int *)((long)&(local_278.pos.row_begin._M_current)->group + 4) ==
                     local_280 + 1);
    }
    local_281 = local_280 % 10 == 5;
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&local_1d0,"dmap.find(i) != dmap.end() && dmap.find(i)->second == i + 1",
               "(i % 10) == 5",(bool *)local_230,&local_281);
    iVar10._M_current = local_1d0.pos.row_begin._M_current;
    if ((char)local_1d0.ht == '\0') {
      testing::Message::Message((Message *)&local_220);
      if (local_1d0.pos.row_begin._M_current ==
          (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           *)0x0) {
        ppVar12 = (pointer)0xafc493;
      }
      else {
        ppVar12 = (local_1d0.pos.row_begin._M_current)->group;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_278,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/simple_unittests.cc"
                 ,0x43,(char *)ppVar12);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_278,(Message *)&local_220);
      goto LAB_005fcfd5;
    }
    if (local_1d0.pos.row_begin._M_current !=
        (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)0x0) {
      if ((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           *)(local_1d0.pos.row_begin._M_current)->group != local_1d0.pos.row_begin._M_current + 1)
      {
        operator_delete((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                         *)(local_1d0.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar10._M_current);
    }
    iVar1 = local_280 + 1;
    bVar3 = local_280 < 99;
    local_280 = iVar1;
  } while (bVar3);
  if (local_140 != (pointer)0x0) {
    free(local_140);
  }
  if (local_f0 != (pointer)0x0) {
    free(local_f0);
  }
  std::
  vector<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>_>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>_>_>
             *)&local_e0.table);
  std::
  vector<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
  ::~vector(&local_88.table.groups);
  return;
}

Assistant:

TEST(Simple, All) {
  google::sparse_hash_set<int> sset;
  google::sparse_hash_map<int, int> smap;
  google::dense_hash_set<int> dset;
  google::dense_hash_map<int, int> dmap;
  dset.set_empty_key(-1);
  dmap.set_empty_key(-1);

  for (int i = 0; i < 100; i += 10) {  // go by tens
    sset.insert(i);
    smap[i] = i + 1;
    dset.insert(i + 5);
    dmap[i + 5] = i + 6;
  }

  for (int i = 0; i < 100; i++) {
    ASSERT_EQ(sset.find(i) != sset.end(), (i % 10) == 0);
    ASSERT_EQ(smap.find(i) != smap.end(), (i % 10) == 0);
    ASSERT_EQ(smap.find(i) != smap.end() && smap.find(i)->second == i + 1,
              (i % 10) == 0);
    ASSERT_EQ(dset.find(i) != dset.end(), (i % 10) == 5);
    ASSERT_EQ(dmap.find(i) != dmap.end(), (i % 10) == 5);
    ASSERT_EQ(dmap.find(i) != dmap.end() && dmap.find(i)->second == i + 1,
              (i % 10) == 5);
  }
}